

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_test.cpp
# Opt level: O0

void __thiscall
GenericExceptionCatcher_Tests::generic_catcher_simple_tests::test_method
          (generic_catcher_simple_tests *this)

{
  undefined7 uVar1;
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  GVar2;
  GenericExceptionHandler<void,_mittens::GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>,_mittens::DefaultNoAction<void>_>
  catcher;
  int *ex;
  undefined1 uStack_99;
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  stdExceptionCatcher;
  GenericExceptionHandler<void,_mittens::UnHandler<int>,_mittens::DefaultNoAction<void>_> allCatcher
  ;
  generic_catcher_simple_tests *this_local;
  
  mittens::generic_handler<void,mittens::UnHandler<int>,int>();
  throw_int(0);
  GVar2 = mittens::generic_handler<std::exception,mittens::UnHandler<int>,int>();
  throw_std_exception();
  throw_int(0);
  uVar1 = GVar2._0_7_;
  GVar2._7_1_ = uStack_99;
  GVar2.failCode_ = (int)uVar1;
  GVar2._4_2_ = (short)((uint7)uVar1 >> 0x20);
  GVar2.supressExceptionsInAction_ = (bool)(char)((uint7)uVar1 >> 0x30);
  mittens::
  generic_handler<void,mittens::GenericExceptionHandler<std::exception,mittens::UnHandler<int>,mittens::DefaultNoAction<std::exception>>,int>
            (-1,GVar2,true);
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(generic_catcher_simple_tests)
{
   auto allCatcher = generic_handler<void>(EXIT_FAILURE, UnHandler<>());
   {
      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, allCatcher.handleException());
      }
   }

   auto stdExceptionCatcher = generic_handler<std::exception>(EXIT_FAILURE, UnHandler<>()); //
   {
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, stdExceptionCatcher.handleException());
      }
   }

   {
      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_THROW(stdExceptionCatcher.handleException(), int);
         BOOST_CHECK_EQUAL(EXIT_FAILURE, allCatcher.handleException());
      }
   }

   {
      // composition test
      auto catcher = generic_handler<void>(-1, stdExceptionCatcher);

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(-1, catcher.handleException());
      }
   }
}